

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O0

FT_Error af_glyph_hints_reload(AF_GlyphHints hints,FT_Outline *outline)

{
  short sVar1;
  int iVar2;
  FT_Vector *pFVar3;
  short *psVar4;
  char *pcVar5;
  long lVar6;
  FT_Memory memory_00;
  AF_Point pAVar7;
  FT_Char FVar8;
  uint uVar9;
  uint uVar10;
  FT_Orientation FVar11;
  FT_Int32 FVar12;
  AF_Direction AVar13;
  FT_Int FVar14;
  short *psVar15;
  FT_Vector *pFVar16;
  AF_Point_conflict pAVar17;
  AF_Point_conflict *ppAVar18;
  AF_Point_conflict pAVar19;
  AF_Point_conflict pAVar20;
  char *pcVar21;
  long lVar22;
  long local_1a8;
  long local_198;
  long local_190;
  long local_180;
  long local_178;
  long local_168;
  AF_Point_conflict prev_v_1;
  AF_Point_conflict next_u_1;
  AF_Point_conflict prev_v;
  AF_Point_conflict next_u;
  FT_Pos out_y_2;
  FT_Pos out_x_2;
  FT_Pos in_y;
  FT_Pos in_x;
  long lStack_110;
  AF_Direction out_dir;
  FT_Pos out_y_1;
  FT_Pos out_x_1;
  AF_Point_conflict curr;
  AF_Point_conflict prev_1;
  AF_Point_conflict next;
  AF_Point_conflict first;
  AF_Point_conflict *contour_limit_1;
  AF_Point_conflict *contour_1;
  FT_Int near_limit2;
  short idx;
  short *end_1;
  AF_Point_conflict *contour_limit;
  AF_Point_conflict *contour;
  FT_Pos out_y;
  FT_Pos out_x;
  AF_Point_conflict pAStack_98;
  FT_Int contour_index;
  AF_Point_conflict prev;
  AF_Point_conflict end;
  byte *pbStack_80;
  FT_Short endpoint;
  char *tag;
  FT_Vector *vec;
  FT_Int near_limit;
  FT_UInt units_per_em;
  AF_Point_conflict point_limit;
  AF_Point_conflict point;
  FT_Memory memory;
  FT_Pos y_delta;
  FT_Pos x_delta;
  FT_Fixed y_scale;
  FT_Fixed x_scale;
  FT_UInt new_max;
  FT_UInt old_max;
  AF_Point_conflict points;
  FT_Outline *pFStack_18;
  FT_Error error;
  FT_Outline *outline_local;
  AF_GlyphHints hints_local;
  
  points._4_4_ = 0;
  pFVar3 = (FT_Vector *)hints->x_scale;
  psVar4 = (short *)hints->y_scale;
  pcVar5 = (char *)hints->x_delta;
  lVar6 = hints->y_delta;
  memory_00 = hints->memory;
  hints->num_points = 0;
  hints->num_contours = 0;
  hints->axis[0].num_segments = 0;
  hints->axis[0].num_edges = 0;
  hints->axis[1].num_segments = 0;
  hints->axis[1].num_edges = 0;
  uVar9 = (uint)outline->n_contours;
  pFStack_18 = outline;
  outline_local = (FT_Outline *)hints;
  if (uVar9 < 9) {
    if (hints->contours == (AF_Point_conflict *)0x0) {
      hints->contours = (hints->embedded).contours;
      hints->max_contours = 8;
    }
  }
  else if ((uint)hints->max_contours < uVar9) {
    if ((anon_struct_7744_2_b586ae8f_for_embedded *)hints->contours == &hints->embedded) {
      hints->contours = (AF_Point_conflict *)0x0;
    }
    uVar9 = uVar9 + 3 & 0xfffffffc;
    psVar15 = (short *)ft_mem_realloc(memory_00,8,(ulong)(uint)hints->max_contours,(ulong)uVar9,
                                      hints->contours,(FT_Error *)((long)&points + 4));
    outline_local[1].contours = psVar15;
    if (points._4_4_ != 0) {
      return points._4_4_;
    }
    *(uint *)&outline_local[1].tags = uVar9;
  }
  sVar1 = pFStack_18->n_points;
  uVar10 = (int)sVar1 + 2;
  uVar9._0_2_ = outline_local[1].n_contours;
  uVar9._2_2_ = outline_local[1].n_points;
  if (uVar10 < 0x61) {
    if (outline_local[1].points == (FT_Vector *)0x0) {
      outline_local[1].points = (FT_Vector *)(outline_local + 0x83);
      outline_local[1].n_contours = 0x60;
      outline_local[1].n_points = 0;
    }
  }
  else if (uVar9 < uVar10) {
    if ((FT_Outline *)outline_local[1].points == outline_local + 0x83) {
      outline_local[1].points = (FT_Vector *)0x0;
    }
    uVar10 = (int)sVar1 + 0xbU & 0xfffffff8;
    pFVar16 = (FT_Vector *)
              ft_mem_realloc(memory_00,0x50,(ulong)uVar9,(ulong)uVar10,outline_local[1].points,
                             (FT_Error *)((long)&points + 4));
    outline_local[1].points = pFVar16;
    if (points._4_4_ != 0) {
      return points._4_4_;
    }
    outline_local[1].n_contours = (short)uVar10;
    outline_local[1].n_points = (short)(uVar10 >> 0x10);
  }
  *(int *)&outline_local[1].field_0x4 = (int)pFStack_18->n_points;
  *(int *)((long)&outline_local[1].tags + 4) = (int)pFStack_18->n_contours;
  *(undefined4 *)&outline_local[2].contours = 2;
  outline_local[0x42].n_contours = -1;
  outline_local[0x42].n_points = -1;
  FVar11 = FT_Outline_Get_Orientation(pFStack_18);
  if (FVar11 == FT_ORIENTATION_FILL_LEFT) {
    *(undefined4 *)&outline_local[2].contours = 0xfffffffe;
    outline_local[0x42].n_contours = 1;
    outline_local[0x42].n_points = 0;
  }
  outline_local->points = pFVar3;
  outline_local->contours = psVar4;
  outline_local->tags = pcVar5;
  *(long *)&outline_local->flags = lVar6;
  outline_local[0x81].n_contours = 0;
  outline_local[0x81].n_points = 0;
  *(undefined4 *)&outline_local[0x81].field_0x4 = 0;
  outline_local[0x81].points = (FT_Vector *)0x0;
  pAVar20 = (AF_Point_conflict)outline_local[1].points;
  if (*(int *)&outline_local[1].field_0x4 != 0) {
    pAVar17 = pAVar20 + *(int *)&outline_local[1].field_0x4;
    uVar9 = (uint)*(ushort *)(*(long *)(*(long *)&outline_local[0x80].flags + 8) + 0x88) * 0x14 >>
            0xb;
    tag = (char *)pFStack_18->points;
    pbStack_80 = (byte *)pFStack_18->tags;
    end._6_2_ = *pFStack_18->contours;
    pAStack_98 = pAVar20 + (int)end._6_2_;
    out_x._4_4_ = 0;
    prev = pAStack_98;
    for (point_limit = pAVar20; point_limit < pAVar17; point_limit = point_limit + 1) {
      point_limit->in_dir = '\x04';
      point_limit->out_dir = '\x04';
      point_limit->fx = *(FT_Short *)tag;
      point_limit->fy = *(FT_Short *)(tag + 8);
      y_scale._0_4_ = (FT_Int32)pFVar3;
      FVar12 = FT_MulFix_x86_64(*(FT_Int32 *)tag,(FT_Int32)y_scale);
      pcVar21 = pcVar5 + FVar12;
      point_limit->x = (FT_Pos)pcVar21;
      point_limit->ox = (FT_Pos)pcVar21;
      x_delta._0_4_ = (FT_Int32)psVar4;
      FVar12 = FT_MulFix_x86_64(*(FT_Int32 *)(tag + 8),(FT_Int32)x_delta);
      lVar22 = FVar12 + lVar6;
      point_limit->y = lVar22;
      point_limit->oy = lVar22;
      prev->fx = (FT_Short)pFStack_18->points[end._6_2_].x;
      prev->fy = (FT_Short)pFStack_18->points[end._6_2_].y;
      if ((*pbStack_80 & 3) == 0) {
        point_limit->flags = 1;
      }
      else if ((*pbStack_80 & 3) == 2) {
        point_limit->flags = 2;
      }
      else {
        point_limit->flags = 0;
      }
      local_168 = (long)((int)point_limit->fx - (int)pAStack_98->fx);
      local_178 = (long)((int)point_limit->fy - (int)pAStack_98->fy);
      if (local_168 < 0) {
        local_168 = -local_168;
      }
      if (local_178 < 0) {
        local_178 = -local_178;
      }
      if (local_168 + local_178 < (long)(int)uVar9) {
        pAStack_98->flags = pAStack_98->flags | 0x20;
      }
      point_limit->prev = pAStack_98;
      pAStack_98->next = point_limit;
      pAStack_98 = point_limit;
      if ((point_limit == prev) &&
         (out_x._4_4_ = out_x._4_4_ + 1, out_x._4_4_ < pFStack_18->n_contours)) {
        end._6_2_ = pFStack_18->contours[out_x._4_4_];
        pAStack_98 = pAVar20 + (int)end._6_2_;
        prev = pAStack_98;
      }
      tag = tag + 0x10;
      pbStack_80 = pbStack_80 + 1;
    }
    contour_limit = (AF_Point_conflict *)outline_local[1].contours;
    ppAVar18 = contour_limit + *(int *)((long)&outline_local[1].tags + 4);
    _near_limit2 = pFStack_18->contours;
    contour_1._6_2_ = 0;
    for (; contour_limit < ppAVar18; contour_limit = contour_limit + 1) {
      *contour_limit = pAVar20 + (int)contour_1._6_2_;
      contour_1._6_2_ = *_near_limit2 + 1;
      _near_limit2 = _near_limit2 + 1;
    }
    psVar4 = outline_local[1].contours;
    iVar2 = *(int *)((long)&outline_local[1].tags + 4);
    for (contour_limit_1 = (AF_Point_conflict *)outline_local[1].contours; point_limit = pAVar20,
        contour_limit_1 < psVar4 + (long)iVar2 * 4; contour_limit_1 = contour_limit_1 + 1) {
      pAVar19 = *contour_limit_1;
      point_limit = pAVar19;
      for (curr = pAVar19->prev; curr != pAVar19; curr = curr->prev) {
        local_180 = (long)((int)point_limit->fx - (int)curr->fx);
        local_190 = (long)((int)point_limit->fy - (int)curr->fy);
        if (local_180 < 0) {
          local_180 = -local_180;
        }
        if (local_190 < 0) {
          local_190 = -local_190;
        }
        if ((long)(int)(uVar9 * 2 + -1) <= local_180 + local_190) break;
        point_limit = curr;
      }
      out_x_1 = (FT_Pos)point_limit;
      point_limit->u = 0;
      point_limit->v = -point_limit->u;
      out_y_1 = 0;
      lStack_110 = 0;
      prev_1 = point_limit;
      do {
        pAVar7 = prev_1->next;
        out_y_1 = ((int)pAVar7->fx - (int)prev_1->fx) + out_y_1;
        lStack_110 = ((int)pAVar7->fy - (int)prev_1->fy) + lStack_110;
        local_198 = out_y_1;
        if (out_y_1 < 0) {
          local_198 = -out_y_1;
        }
        local_1a8 = lStack_110;
        if (lStack_110 < 0) {
          local_1a8 = -lStack_110;
        }
        if (local_198 + local_1a8 < (long)(int)uVar9) {
          pAVar7->flags = pAVar7->flags | 0x10;
        }
        else {
          *(long *)(out_x_1 + 0x30) = ((long)pAVar7 - out_x_1) / 0x50;
          pAVar7->v = -*(long *)(out_x_1 + 0x30);
          AVar13 = af_direction_compute(out_y_1,lStack_110);
          FVar8 = (FT_Char)AVar13;
          *(FT_Char *)(out_x_1 + 3) = FVar8;
          for (out_x_1 = *(FT_Pos *)(out_x_1 + 0x40); (AF_Point)out_x_1 != pAVar7;
              out_x_1 = *(FT_Pos *)(out_x_1 + 0x40)) {
            *(FT_Char *)(out_x_1 + 2) = FVar8;
            *(FT_Char *)(out_x_1 + 3) = FVar8;
          }
          pAVar7->in_dir = FVar8;
          *(long *)(out_x_1 + 0x30) = ((long)point_limit - out_x_1) / 0x50;
          point_limit->v = -*(long *)(out_x_1 + 0x30);
          out_y_1 = 0;
          lStack_110 = 0;
        }
        prev_1 = pAVar7;
      } while (pAVar7 != point_limit);
    }
    for (; point_limit < pAVar17; point_limit = point_limit + 1) {
      if ((((point_limit->flags & 0x10) == 0) && (point_limit->in_dir == '\x04')) &&
         (point_limit->out_dir == '\x04')) {
        lVar6 = point_limit->u;
        pAVar19 = point_limit + point_limit->v;
        if ((-1 < ((int)point_limit->fx - (int)pAVar19->fx ^
                  (int)point_limit[lVar6].fx - (int)point_limit->fx)) &&
           (-1 < ((int)point_limit->fy - (int)pAVar19->fy ^
                 (int)point_limit[lVar6].fy - (int)point_limit->fy))) {
          point_limit->flags = point_limit->flags | 0x10;
          pAVar19->u = ((long)point_limit + (lVar6 * 0x50 - (long)pAVar19)) / 0x50;
          point_limit[lVar6].v = -pAVar19->u;
        }
      }
    }
    while (point_limit = pAVar20, point_limit < pAVar17) {
      if ((point_limit->flags & 0x10) == 0) {
        if ((point_limit->flags & 3) == 0) {
          if (point_limit->out_dir == point_limit->in_dir) {
            if (point_limit->out_dir == '\x04') {
              lVar6 = point_limit->u;
              pAVar20 = point_limit + point_limit->v;
              FVar14 = ft_corner_is_flat((long)((int)point_limit->fx - (int)pAVar20->fx),
                                         (long)((int)point_limit->fy - (int)pAVar20->fy),
                                         (long)((int)point_limit[lVar6].fx - (int)point_limit->fx),
                                         (long)((int)point_limit[lVar6].fy - (int)point_limit->fy));
              if (FVar14 == 0) goto LAB_001c5456;
              pAVar20->u = ((long)point_limit + (lVar6 * 0x50 - (long)pAVar20)) / 0x50;
              point_limit[lVar6].v = -pAVar20->u;
            }
          }
          else if ((int)point_limit->in_dir != -(int)point_limit->out_dir) goto LAB_001c5456;
        }
        point_limit->flags = point_limit->flags | 0x10;
      }
LAB_001c5456:
      pAVar20 = point_limit + 1;
    }
  }
  return points._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_glyph_hints_reload( AF_GlyphHints  hints,
                         FT_Outline*    outline )
  {
    FT_Error   error   = FT_Err_Ok;
    AF_Point   points;
    FT_UInt    old_max, new_max;
    FT_Fixed   x_scale = hints->x_scale;
    FT_Fixed   y_scale = hints->y_scale;
    FT_Pos     x_delta = hints->x_delta;
    FT_Pos     y_delta = hints->y_delta;
    FT_Memory  memory  = hints->memory;


    hints->num_points   = 0;
    hints->num_contours = 0;

    hints->axis[0].num_segments = 0;
    hints->axis[0].num_edges    = 0;
    hints->axis[1].num_segments = 0;
    hints->axis[1].num_edges    = 0;

    /* first of all, reallocate the contours array if necessary */
    new_max = (FT_UInt)outline->n_contours;
    old_max = (FT_UInt)hints->max_contours;

    if ( new_max <= AF_CONTOURS_EMBEDDED )
    {
      if ( !hints->contours )
      {
        hints->contours     = hints->embedded.contours;
        hints->max_contours = AF_CONTOURS_EMBEDDED;
      }
    }
    else if ( new_max > old_max )
    {
      if ( hints->contours == hints->embedded.contours )
        hints->contours = NULL;

      new_max = ( new_max + 3 ) & ~3U; /* round up to a multiple of 4 */

      if ( FT_RENEW_ARRAY( hints->contours, old_max, new_max ) )
        goto Exit;

      hints->max_contours = (FT_Int)new_max;
    }

    /*
     *  then reallocate the points arrays if necessary --
     *  note that we reserve two additional point positions, used to
     *  hint metrics appropriately
     */
    new_max = (FT_UInt)( outline->n_points + 2 );
    old_max = (FT_UInt)hints->max_points;

    if ( new_max <= AF_POINTS_EMBEDDED )
    {
      if ( !hints->points )
      {
        hints->points     = hints->embedded.points;
        hints->max_points = AF_POINTS_EMBEDDED;
      }
    }
    else if ( new_max > old_max )
    {
      if ( hints->points == hints->embedded.points )
        hints->points = NULL;

      new_max = ( new_max + 2 + 7 ) & ~7U; /* round up to a multiple of 8 */

      if ( FT_RENEW_ARRAY( hints->points, old_max, new_max ) )
        goto Exit;

      hints->max_points = (FT_Int)new_max;
    }

    hints->num_points   = outline->n_points;
    hints->num_contours = outline->n_contours;

    /* We can't rely on the value of `FT_Outline.flags' to know the fill   */
    /* direction used for a glyph, given that some fonts are broken (e.g., */
    /* the Arphic ones).  We thus recompute it each time we need to.       */
    /*                                                                     */
    hints->axis[AF_DIMENSION_HORZ].major_dir = AF_DIR_UP;
    hints->axis[AF_DIMENSION_VERT].major_dir = AF_DIR_LEFT;

    if ( FT_Outline_Get_Orientation( outline ) == FT_ORIENTATION_POSTSCRIPT )
    {
      hints->axis[AF_DIMENSION_HORZ].major_dir = AF_DIR_DOWN;
      hints->axis[AF_DIMENSION_VERT].major_dir = AF_DIR_RIGHT;
    }

    hints->x_scale = x_scale;
    hints->y_scale = y_scale;
    hints->x_delta = x_delta;
    hints->y_delta = y_delta;

    hints->xmin_delta = 0;
    hints->xmax_delta = 0;

    points = hints->points;
    if ( hints->num_points == 0 )
      goto Exit;

    {
      AF_Point  point;
      AF_Point  point_limit = points + hints->num_points;

      /* value 20 in `near_limit' is heuristic */
      FT_UInt  units_per_em = hints->metrics->scaler.face->units_per_EM;
      FT_Int   near_limit   = 20 * units_per_em / 2048;


      /* compute coordinates & Bezier flags, next and prev */
      {
        FT_Vector*  vec           = outline->points;
        char*       tag           = outline->tags;
        FT_Short    endpoint      = outline->contours[0];
        AF_Point    end           = points + endpoint;
        AF_Point    prev          = end;
        FT_Int      contour_index = 0;


        for ( point = points; point < point_limit; point++, vec++, tag++ )
        {
          FT_Pos  out_x, out_y;


          point->in_dir  = (FT_Char)AF_DIR_NONE;
          point->out_dir = (FT_Char)AF_DIR_NONE;

          point->fx = (FT_Short)vec->x;
          point->fy = (FT_Short)vec->y;
          point->ox = point->x = FT_MulFix( vec->x, x_scale ) + x_delta;
          point->oy = point->y = FT_MulFix( vec->y, y_scale ) + y_delta;

          end->fx = (FT_Short)outline->points[endpoint].x;
          end->fy = (FT_Short)outline->points[endpoint].y;

          switch ( FT_CURVE_TAG( *tag ) )
          {
          case FT_CURVE_TAG_CONIC:
            point->flags = AF_FLAG_CONIC;
            break;
          case FT_CURVE_TAG_CUBIC:
            point->flags = AF_FLAG_CUBIC;
            break;
          default:
            point->flags = AF_FLAG_NONE;
          }

          out_x = point->fx - prev->fx;
          out_y = point->fy - prev->fy;

          if ( FT_ABS( out_x ) + FT_ABS( out_y ) < near_limit )
            prev->flags |= AF_FLAG_NEAR;

          point->prev = prev;
          prev->next  = point;
          prev        = point;

          if ( point == end )
          {
            if ( ++contour_index < outline->n_contours )
            {
              endpoint = outline->contours[contour_index];
              end      = points + endpoint;
              prev     = end;
            }
          }
        }
      }

      /* set up the contours array */
      {
        AF_Point*  contour       = hints->contours;
        AF_Point*  contour_limit = contour + hints->num_contours;
        short*     end           = outline->contours;
        short      idx           = 0;


        for ( ; contour < contour_limit; contour++, end++ )
        {
          contour[0] = points + idx;
          idx        = (short)( end[0] + 1 );
        }
      }

      {
        /*
         *  Compute directions of `in' and `out' vectors.
         *
         *  Note that distances between points that are very near to each
         *  other are accumulated.  In other words, the auto-hinter either
         *  prepends the small vectors between near points to the first
         *  non-near vector, or the sum of small vector lengths exceeds a
         *  threshold, thus `grouping' the small vectors.  All intermediate
         *  points are tagged as weak; the directions are adjusted also to
         *  be equal to the accumulated one.
         */

        FT_Int  near_limit2 = 2 * near_limit - 1;

        AF_Point*  contour;
        AF_Point*  contour_limit = hints->contours + hints->num_contours;


        for ( contour = hints->contours; contour < contour_limit; contour++ )
        {
          AF_Point  first = *contour;
          AF_Point  next, prev, curr;

          FT_Pos  out_x, out_y;


          /* since the first point of a contour could be part of a */
          /* series of near points, go backwards to find the first */
          /* non-near point and adjust `first'                     */

          point = first;
          prev  = first->prev;

          while ( prev != first )
          {
            out_x = point->fx - prev->fx;
            out_y = point->fy - prev->fy;

            /*
             *  We use Taxicab metrics to measure the vector length.
             *
             *  Note that the accumulated distances so far could have the
             *  opposite direction of the distance measured here.  For this
             *  reason we use `near_limit2' for the comparison to get a
             *  non-near point even in the worst case.
             */
            if ( FT_ABS( out_x ) + FT_ABS( out_y ) >= near_limit2 )
              break;

            point = prev;
            prev  = prev->prev;
          }

          /* adjust first point */
          first = point;

          /* now loop over all points of the contour to get */
          /* `in' and `out' vector directions               */

          curr = first;

          /*
           *  We abuse the `u' and `v' fields to store index deltas to the
           *  next and previous non-near point, respectively.
           *
           *  To avoid problems with not having non-near points, we point to
           *  `first' by default as the next non-near point.
           *
           */
          curr->u  = (FT_Pos)( first - curr );
          first->v = -curr->u;

          out_x = 0;
          out_y = 0;

          next = first;
          do
          {
            AF_Direction  out_dir;


            point = next;
            next  = point->next;

            out_x += next->fx - point->fx;
            out_y += next->fy - point->fy;

            if ( FT_ABS( out_x ) + FT_ABS( out_y ) < near_limit )
            {
              next->flags |= AF_FLAG_WEAK_INTERPOLATION;
              continue;
            }

            curr->u = (FT_Pos)( next - curr );
            next->v = -curr->u;

            out_dir = af_direction_compute( out_x, out_y );

            /* adjust directions for all points inbetween; */
            /* the loop also updates position of `curr'    */
            curr->out_dir = (FT_Char)out_dir;
            for ( curr = curr->next; curr != next; curr = curr->next )
            {
              curr->in_dir  = (FT_Char)out_dir;
              curr->out_dir = (FT_Char)out_dir;
            }
            next->in_dir = (FT_Char)out_dir;

            curr->u  = (FT_Pos)( first - curr );
            first->v = -curr->u;

            out_x = 0;
            out_y = 0;

          } while ( next != first );
        }

        /*
         *  The next step is to `simplify' an outline's topology so that we
         *  can identify local extrema more reliably: A series of
         *  non-horizontal or non-vertical vectors pointing into the same
         *  quadrant are handled as a single, long vector.  From a
         *  topological point of the view, the intermediate points are of no
         *  interest and thus tagged as weak.
         */

        for ( point = points; point < point_limit; point++ )
        {
          if ( point->flags & AF_FLAG_WEAK_INTERPOLATION )
            continue;

          if ( point->in_dir  == AF_DIR_NONE &&
               point->out_dir == AF_DIR_NONE )
          {
            /* check whether both vectors point into the same quadrant */

            FT_Pos  in_x, in_y;
            FT_Pos  out_x, out_y;

            AF_Point  next_u = point + point->u;
            AF_Point  prev_v = point + point->v;


            in_x = point->fx - prev_v->fx;
            in_y = point->fy - prev_v->fy;

            out_x = next_u->fx - point->fx;
            out_y = next_u->fy - point->fy;

            if ( ( in_x ^ out_x ) >= 0 && ( in_y ^ out_y ) >= 0 )
            {
              /* yes, so tag current point as weak */
              /* and update index deltas           */

              point->flags |= AF_FLAG_WEAK_INTERPOLATION;

              prev_v->u = (FT_Pos)( next_u - prev_v );
              next_u->v = -prev_v->u;
            }
          }
        }

        /*
         *  Finally, check for remaining weak points.  Everything else not
         *  collected in edges so far is then implicitly classified as strong
         *  points.
         */

        for ( point = points; point < point_limit; point++ )
        {
          if ( point->flags & AF_FLAG_WEAK_INTERPOLATION )
            continue;

          if ( point->flags & AF_FLAG_CONTROL )
          {
            /* control points are always weak */
          Is_Weak_Point:
            point->flags |= AF_FLAG_WEAK_INTERPOLATION;
          }
          else if ( point->out_dir == point->in_dir )
          {
            if ( point->out_dir != AF_DIR_NONE )
            {
              /* current point lies on a horizontal or          */
              /* vertical segment (but doesn't start or end it) */
              goto Is_Weak_Point;
            }

            {
              AF_Point  next_u = point + point->u;
              AF_Point  prev_v = point + point->v;


              if ( ft_corner_is_flat( point->fx  - prev_v->fx,
                                      point->fy  - prev_v->fy,
                                      next_u->fx - point->fx,
                                      next_u->fy - point->fy ) )
              {
                /* either the `in' or the `out' vector is much more  */
                /* dominant than the other one, so tag current point */
                /* as weak and update index deltas                   */

                prev_v->u = (FT_Pos)( next_u - prev_v );
                next_u->v = -prev_v->u;

                goto Is_Weak_Point;
              }
            }
          }
          else if ( point->in_dir == -point->out_dir )
          {
            /* current point forms a spike */
            goto Is_Weak_Point;
          }
        }
      }
    }

  Exit:
    return error;
  }